

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclPlatform.cpp
# Opt level: O0

void xmrig::OclPlatform::print(void)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  int __c;
  OclPlatform **__s;
  OclPlatform *platform;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *__range1;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> platforms;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *in_stack_ffffffffffffff28;
  String *in_stack_ffffffffffffff30;
  OclPlatform *in_stack_ffffffffffffff38;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *in_stack_ffffffffffffff40;
  String local_98;
  String local_88;
  String local_78;
  String local_68;
  String local_58;
  reference local_48;
  OclPlatform *local_40;
  __normal_iterator<const_xmrig::OclPlatform_*,_std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>_>
  local_38;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *local_30;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> local_18;
  
  get();
  sVar2 = std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::size(&local_18);
  printf("%-28s%zu\n\n","Number of platforms:",sVar2);
  local_30 = &local_18;
  local_38._M_current =
       (OclPlatform *)
       std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::begin
                 (in_stack_ffffffffffffff28);
  local_40 = (OclPlatform *)
             std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::end
                       (in_stack_ffffffffffffff28);
  while( true ) {
    __s = &local_40;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xmrig::OclPlatform_*,_std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<const_xmrig::OclPlatform_*,_std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<const_xmrig::OclPlatform_*,_std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>_>
               ::operator*(&local_38);
    pcVar3 = index(local_48,(char *)__s,__c);
    printf("  %-26s%zu\n","Index:",pcVar3);
    profile(in_stack_ffffffffffffff38);
    pcVar3 = String::data(&local_58);
    printf("  %-26s%s\n","Profile:",pcVar3);
    String::~String(in_stack_ffffffffffffff30);
    version(in_stack_ffffffffffffff38);
    pcVar3 = String::data(&local_68);
    printf("  %-26s%s\n","Version:",pcVar3);
    String::~String(in_stack_ffffffffffffff30);
    name(in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff40 =
         (vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> *)String::data(&local_78);
    printf("  %-26s%s\n","Name:",in_stack_ffffffffffffff40);
    String::~String(in_stack_ffffffffffffff30);
    vendor(in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff38 = (OclPlatform *)String::data(&local_88);
    printf("  %-26s%s\n","Vendor:",in_stack_ffffffffffffff38);
    String::~String(in_stack_ffffffffffffff30);
    extensions(in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff30 = (String *)String::data(&local_98);
    printf("  %-26s%s\n\n","Extensions:",in_stack_ffffffffffffff30);
    String::~String(in_stack_ffffffffffffff30);
    __gnu_cxx::
    __normal_iterator<const_xmrig::OclPlatform_*,_std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>_>
    ::operator++(&local_38);
  }
  std::vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::~vector
            (in_stack_ffffffffffffff40);
  return;
}

Assistant:

void xmrig::OclPlatform::print()
{
    const auto platforms = OclPlatform::get();

    printf("%-28s%zu\n\n", "Number of platforms:", platforms.size());

    for (const auto &platform : platforms) {
        printf("  %-26s%zu\n",  "Index:",       platform.index());
        printf("  %-26s%s\n",   "Profile:",     platform.profile().data());
        printf("  %-26s%s\n",   "Version:",     platform.version().data());
        printf("  %-26s%s\n",   "Name:",        platform.name().data());
        printf("  %-26s%s\n",   "Vendor:",      platform.vendor().data());
        printf("  %-26s%s\n\n", "Extensions:",  platform.extensions().data());
    }
}